

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::container_internal::HashSetResizeHelper::
GrowIntoSingleGroupShuffleTransferableSlots
          (HashSetResizeHelper *this,void *new_slots,size_t slot_size)

{
  if (this->old_capacity_ == 0) {
    __assert_fail("old_capacity_ > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                  ,0x1ef,
                  "void absl::container_internal::HashSetResizeHelper::GrowIntoSingleGroupShuffleTransferableSlots(void *, size_t) const"
                 );
  }
  if (this->was_soo_ != true) {
    memcpy((void *)((long)new_slots + slot_size),(this->old_heap_or_soo_).heap.slot_array.p,
           this->old_capacity_ * slot_size);
    return;
  }
  __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x7ea,"void *absl::container_internal::HashSetResizeHelper::old_slots() const");
}

Assistant:

void HashSetResizeHelper::GrowIntoSingleGroupShuffleTransferableSlots(
    void* new_slots, size_t slot_size) const {
  ABSL_ASSUME(old_capacity_ > 0);
  SanitizerUnpoisonMemoryRegion(old_slots(), slot_size * old_capacity_);
  std::memcpy(SlotAddress(new_slots, 1, slot_size), old_slots(),
              slot_size * old_capacity_);
}